

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int re2::Regexp::FactorAlternation(Regexp **sub,int nsub,ParseFlags flags)

{
  int iVar1;
  Regexp **ppRVar2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  pointer pSVar6;
  reference pvVar7;
  int nsuffix;
  Regexp *re [2];
  int i;
  int out;
  iterator iter;
  int *spliceidx;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices;
  int *round;
  int *nsub_1;
  Regexp ***sub_1;
  vector<re2::Frame,_std::allocator<re2::Frame>_> stk;
  ParseFlags in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  ostream *in_stack_fffffffffffffbe0;
  ostream *in_stack_fffffffffffffbe8;
  LogMessage *in_stack_fffffffffffffbf0;
  ostream *in_stack_fffffffffffffc10;
  ostream *in_stack_fffffffffffffc18;
  LogMessage *in_stack_fffffffffffffc20;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *in_stack_fffffffffffffc30;
  Regexp *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc44;
  LogMessage local_398;
  int local_214;
  Splice *local_210;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *in_stack_fffffffffffffe80;
  ParseFlags in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  Regexp **in_stack_fffffffffffffe90;
  int local_70;
  int local_6c;
  __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_> local_68
  ;
  int *local_60;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *local_58;
  int *local_50;
  int *local_48;
  reference local_40;
  vector<re2::Frame,_std::allocator<re2::Frame>_> local_28;
  
  std::vector<re2::Frame,_std::allocator<re2::Frame>_>::vector
            ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)0x23b7f2);
  std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
            ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbf0,
             (Regexp ***)in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
LAB_0023b813:
  while( true ) {
    local_40 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                         ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)
                          in_stack_fffffffffffffbe0);
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbe0
                       );
    local_48 = &pvVar4->nsub;
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbe0
                       );
    local_50 = &pvVar4->round;
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbe0
                       );
    local_58 = &pvVar4->splices;
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbe0
                       );
    local_60 = &pvVar4->spliceidx;
    bVar3 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::empty
                      ((vector<re2::Splice,_std::allocator<re2::Splice>_> *)
                       in_stack_fffffffffffffbf0);
    if (bVar3) break;
    iVar1 = *local_60;
    sVar5 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::size(local_58);
    if ((int)sVar5 <= iVar1) {
      local_68._M_current =
           (Splice *)
           std::vector<re2::Splice,_std::allocator<re2::Splice>_>::begin
                     ((vector<re2::Splice,_std::allocator<re2::Splice>_> *)
                      CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      local_6c = 0;
      local_70 = 0;
      while (local_70 < *local_48) {
        while (ppRVar2 = local_40->sub,
              pSVar6 = __gnu_cxx::
                       __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                       ::operator->(&local_68), ppRVar2 + local_70 < pSVar6->sub) {
          local_40->sub[local_6c] = local_40->sub[local_70];
          local_70 = local_70 + 1;
          local_6c = local_6c + 1;
        }
        in_stack_fffffffffffffc44 = *local_50;
        if (in_stack_fffffffffffffc44 - 1U < 2) {
          __gnu_cxx::
          __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
          ::operator->(&local_68);
          pSVar6 = __gnu_cxx::
                   __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                   ::operator->(&local_68);
          in_stack_fffffffffffffc30 =
               (vector<re2::Splice,_std::allocator<re2::Splice>_> *)pSVar6->sub;
          __gnu_cxx::
          __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
          ::operator->(&local_68);
          in_stack_fffffffffffffc38 =
               AlternateNoFactor((Regexp **)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                                 in_stack_fffffffffffffbd8);
          in_stack_fffffffffffffc20 =
               (LogMessage *)
               Concat((Regexp **)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                      in_stack_fffffffffffffbd8);
          local_40->sub[local_6c] = (Regexp *)in_stack_fffffffffffffc20;
          pSVar6 = __gnu_cxx::
                   __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                   ::operator->(&local_68);
          local_70 = pSVar6->nsub + local_70;
          local_6c = local_6c + 1;
        }
        else if (in_stack_fffffffffffffc44 == 3) {
          pSVar6 = __gnu_cxx::
                   __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                   ::operator->(&local_68);
          local_40->sub[local_6c] = pSVar6->prefix;
          pSVar6 = __gnu_cxx::
                   __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                   ::operator->(&local_68);
          local_70 = pSVar6->nsub + local_70;
          local_6c = local_6c + 1;
        }
        else {
          LogMessage::LogMessage
                    (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
                     (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
          in_stack_fffffffffffffc18 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffdf8);
          in_stack_fffffffffffffc10 = std::operator<<(in_stack_fffffffffffffc18,"unknown round: ");
          std::ostream::operator<<(in_stack_fffffffffffffc10,*local_50);
          LogMessage::~LogMessage(in_stack_fffffffffffffbf0);
        }
        __gnu_cxx::
        __normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>::
        operator++(&local_68);
        local_210 = (Splice *)
                    std::vector<re2::Splice,_std::allocator<re2::Splice>_>::end
                              ((vector<re2::Splice,_std::allocator<re2::Splice>_> *)
                               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
        bVar3 = __gnu_cxx::operator==
                          ((__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                            *)in_stack_fffffffffffffbe0,
                           (__normal_iterator<re2::Splice_*,_std::vector<re2::Splice,_std::allocator<re2::Splice>_>_>
                            *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
        if (bVar3) {
          while (local_70 < *local_48) {
            local_40->sub[local_6c] = local_40->sub[local_70];
            local_70 = local_70 + 1;
            local_6c = local_6c + 1;
          }
        }
      }
      std::vector<re2::Splice,_std::allocator<re2::Splice>_>::clear
                ((vector<re2::Splice,_std::allocator<re2::Splice>_> *)0x23bcb4);
      *local_48 = local_6c;
      *local_50 = *local_50 + 1;
      goto LAB_0023bcd6;
    }
    std::vector<re2::Splice,_std::allocator<re2::Splice>_>::operator[](local_58,(long)*local_60);
    std::vector<re2::Splice,_std::allocator<re2::Splice>_>::operator[](local_58,(long)*local_60);
    std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
              ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbf0,
               (Regexp ***)in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
  }
  *local_50 = *local_50 + 1;
LAB_0023bcd6:
  switch(*local_50) {
  case 1:
    FactorAlternationImpl::Round1
              ((Regexp **)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (int)((ulong)in_stack_fffffffffffffc38 >> 0x20),(ParseFlags)in_stack_fffffffffffffc38
               ,in_stack_fffffffffffffc30);
    break;
  case 2:
    FactorAlternationImpl::Round2
              ((Regexp **)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (ParseFlags)in_stack_fffffffffffffc18,
               (vector<re2::Splice,_std::allocator<re2::Splice>_> *)in_stack_fffffffffffffc10);
    break;
  case 3:
    FactorAlternationImpl::Round3
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffe80);
    break;
  case 4:
    sVar5 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::size(&local_28);
    if (sVar5 == 1) {
      iVar1 = *local_48;
      std::vector<re2::Frame,_std::allocator<re2::Frame>_>::~vector
                ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbf0);
      return iVar1;
    }
    local_214 = *local_48;
    std::vector<re2::Frame,_std::allocator<re2::Frame>_>::pop_back
              ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)0x23bdef);
    iVar1 = local_214;
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbe0
                       );
    in_stack_fffffffffffffbf0 = (LogMessage *)&pvVar4->splices;
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbe0
                       );
    pvVar7 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::operator[]
                       ((vector<re2::Splice,_std::allocator<re2::Splice>_> *)
                        in_stack_fffffffffffffbf0,(long)pvVar4->spliceidx);
    pvVar7->nsuffix = iVar1;
    pvVar4 = std::vector<re2::Frame,_std::allocator<re2::Frame>_>::back
                       ((vector<re2::Frame,_std::allocator<re2::Frame>_> *)in_stack_fffffffffffffbe0
                       );
    pvVar4->spliceidx = pvVar4->spliceidx + 1;
    goto LAB_0023b813;
  default:
    LogMessage::LogMessage
              (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
               (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
    in_stack_fffffffffffffbe8 = LogMessage::stream(&local_398);
    in_stack_fffffffffffffbe0 = std::operator<<(in_stack_fffffffffffffbe8,"unknown round: ");
    std::ostream::operator<<(in_stack_fffffffffffffbe0,*local_50);
    LogMessage::~LogMessage(in_stack_fffffffffffffbf0);
  }
  bVar3 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::empty
                    ((vector<re2::Splice,_std::allocator<re2::Splice>_> *)in_stack_fffffffffffffbf0)
  ;
  if ((bVar3) || (*local_50 == 3)) {
    sVar5 = std::vector<re2::Splice,_std::allocator<re2::Splice>_>::size(local_58);
    *local_60 = (int)sVar5;
  }
  else {
    *local_60 = 0;
  }
  goto LAB_0023b813;
}

Assistant:

int Regexp::FactorAlternation(Regexp** sub, int nsub, ParseFlags flags) {
  std::vector<Frame> stk;
  stk.emplace_back(sub, nsub);

  for (;;) {
    auto& sub = stk.back().sub;
    auto& nsub = stk.back().nsub;
    auto& round = stk.back().round;
    auto& splices = stk.back().splices;
    auto& spliceidx = stk.back().spliceidx;

    if (splices.empty()) {
      // Advance to the next round of factoring. Note that this covers
      // the initialised state: when splices is empty and round is 0.
      round++;
    } else if (spliceidx < static_cast<int>(splices.size())) {
      // We have at least one more Splice to factor. Recurse logically.
      stk.emplace_back(splices[spliceidx].sub, splices[spliceidx].nsub);
      continue;
    } else {
      // We have no more Splices to factor. Apply them.
      auto iter = splices.begin();
      int out = 0;
      for (int i = 0; i < nsub; ) {
        // Copy until we reach where the next Splice begins.
        while (sub + i < iter->sub)
          sub[out++] = sub[i++];
        switch (round) {
          case 1:
          case 2: {
            // Assemble the Splice prefix and the suffixes.
            Regexp* re[2];
            re[0] = iter->prefix;
            re[1] = Regexp::AlternateNoFactor(iter->sub, iter->nsuffix, flags);
            sub[out++] = Regexp::Concat(re, 2, flags);
            i += iter->nsub;
            break;
          }
          case 3:
            // Just use the Splice prefix.
            sub[out++] = iter->prefix;
            i += iter->nsub;
            break;
          default:
            LOG(DFATAL) << "unknown round: " << round;
            break;
        }
        // If we are done, copy until the end of sub.
        if (++iter == splices.end()) {
          while (i < nsub)
            sub[out++] = sub[i++];
        }
      }
      splices.clear();
      nsub = out;
      // Advance to the next round of factoring.
      round++;
    }

    switch (round) {
      case 1:
        FactorAlternationImpl::Round1(sub, nsub, flags, &splices);
        break;
      case 2:
        FactorAlternationImpl::Round2(sub, nsub, flags, &splices);
        break;
      case 3:
        FactorAlternationImpl::Round3(sub, nsub, flags, &splices);
        break;
      case 4:
        if (stk.size() == 1) {
          // We are at the top of the stack. Just return.
          return nsub;
        } else {
          // Pop the stack and set the number of suffixes.
          // (Note that references will be invalidated!)
          int nsuffix = nsub;
          stk.pop_back();
          stk.back().splices[stk.back().spliceidx].nsuffix = nsuffix;
          ++stk.back().spliceidx;
          continue;
        }
      default:
        LOG(DFATAL) << "unknown round: " << round;
        break;
    }

    // Set spliceidx depending on whether we have Splices to factor.
    if (splices.empty() || round == 3) {
      spliceidx = static_cast<int>(splices.size());
    } else {
      spliceidx = 0;
    }
  }
}